

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

TimingControl *
slang::ast::CycleDelayControl::fromSyntax
          (Compilation *compilation,DelaySyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  CycleDelayControl *ctrl;
  Symbol *pSVar3;
  SourceRange sourceRange;
  SourceRange local_38;
  
  iVar2 = Expression::bind((int)(syntax->delayValue).ptr,(sockaddr *)context,0);
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ctrl = BumpAllocator::
         emplace<slang::ast::CycleDelayControl,slang::ast::Expression_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,(Expression *)CONCAT44(extraout_var,iVar2),
                    &local_38);
  bVar1 = ASTContext::requireIntegral(context,(Expression *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    if (((context->flags).m_bits & 0x100000) == 0) {
      bVar1 = Scope::isUninstantiated((context->scope).ptr);
      if (!bVar1) {
        pSVar3 = Compilation::getDefaultClocking(compilation,(context->scope).ptr);
        if (pSVar3 == (Symbol *)0x0) {
          sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          ASTContext::addDiag(context,(DiagCode)0x2e0008,sourceRange);
        }
      }
    }
  }
  else {
    ctrl = (CycleDelayControl *)TimingControl::badCtrl(compilation,&ctrl->super_TimingControl);
  }
  return &ctrl->super_TimingControl;
}

Assistant:

TimingControl& CycleDelayControl::fromSyntax(Compilation& compilation, const DelaySyntax& syntax,
                                             const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.delayValue, context);
    auto result = compilation.emplace<CycleDelayControl>(expr, syntax.sourceRange());

    if (!context.requireIntegral(expr))
        return badCtrl(compilation, result);

    if (!context.flags.has(ASTFlags::LValue) && !context.scope->isUninstantiated() &&
        !compilation.getDefaultClocking(*context.scope)) {
        context.addDiag(diag::NoDefaultClocking, syntax.sourceRange());
    }

    return *result;
}